

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O1

int pkcs12_pbe_cipher_init
              (pbe_suite *suite,EVP_CIPHER_CTX *ctx,uint32_t iterations,char *pass,size_t pass_len,
              uint8_t *salt,size_t salt_len,int is_encrypt)

{
  uint uVar1;
  int iVar2;
  EVP_CIPHER *cipher;
  EVP_MD *md;
  uint8_t iv [16];
  uint8_t key [64];
  
  cipher = (EVP_CIPHER *)(*suite->cipher_func)();
  md = (*suite->md_func)();
  uVar1 = EVP_CIPHER_key_length(cipher);
  iVar2 = pkcs12_key_gen(pass,pass_len,salt,salt_len,'\x01',iterations,(ulong)uVar1,key,md);
  if (iVar2 != 0) {
    uVar1 = EVP_CIPHER_iv_length(cipher);
    iVar2 = pkcs12_key_gen(pass,pass_len,salt,salt_len,'\x02',iterations,(ulong)uVar1,iv,md);
    if (iVar2 != 0) {
      iVar2 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)ctx,cipher,(ENGINE *)0x0,key,iv,is_encrypt);
      OPENSSL_cleanse(key,0x40);
      OPENSSL_cleanse(iv,0x10);
      return iVar2;
    }
  }
  ERR_put_error(0x13,0,0x6e,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                ,0xc9);
  return 0;
}

Assistant:

static int pkcs12_pbe_cipher_init(const struct pbe_suite *suite,
                                  EVP_CIPHER_CTX *ctx, uint32_t iterations,
                                  const char *pass, size_t pass_len,
                                  const uint8_t *salt, size_t salt_len,
                                  int is_encrypt) {
  const EVP_CIPHER *cipher = suite->cipher_func();
  const EVP_MD *md = suite->md_func();

  uint8_t key[EVP_MAX_KEY_LENGTH];
  uint8_t iv[EVP_MAX_IV_LENGTH];
  if (!pkcs12_key_gen(pass, pass_len, salt, salt_len, PKCS12_KEY_ID, iterations,
                      EVP_CIPHER_key_length(cipher), key, md) ||
      !pkcs12_key_gen(pass, pass_len, salt, salt_len, PKCS12_IV_ID, iterations,
                      EVP_CIPHER_iv_length(cipher), iv, md)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_KEY_GEN_ERROR);
    return 0;
  }

  int ret = EVP_CipherInit_ex(ctx, cipher, NULL, key, iv, is_encrypt);
  OPENSSL_cleanse(key, EVP_MAX_KEY_LENGTH);
  OPENSSL_cleanse(iv, EVP_MAX_IV_LENGTH);
  return ret;
}